

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

FB * __thiscall
amrex::FabArrayBase::getFB
          (FabArrayBase *this,IntVect *nghost,Periodicity *period,bool cross,
          bool enforce_periodicity_only,bool override_sync)

{
  undefined8 uVar1;
  bool bVar2;
  pointer ppVar3;
  IndexType *pIVar4;
  IntVect *pIVar5;
  FB *pFVar6;
  undefined4 in_ECX;
  Periodicity *in_RDX;
  IntVect *in_RSI;
  FabArrayBase *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  uint uVar7;
  uint uVar8;
  IntVect IVar9;
  FB *new_fb;
  FBCacheIter it;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>_>
  er_it;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  const_iterator in_stack_fffffffffffffe68;
  BoxArray *in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffead;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 in_stack_fffffffffffffeaf;
  undefined1 cross_00;
  FB *in_stack_fffffffffffffed0;
  pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*> local_128;
  _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
  local_110 [3];
  FB *local_f8;
  int local_f0 [3];
  undefined8 local_e0;
  int local_d8;
  uint local_d4;
  _Self local_d0;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>_>
  local_c8;
  byte local_b3;
  byte local_b2;
  byte local_b1;
  Periodicity *local_b0;
  IntVect *local_a8;
  IntVect *local_90;
  IntVect *local_88;
  undefined8 *local_80;
  IntVect *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  undefined4 local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  IntVect *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  uint *local_10;
  IndexType *local_8;
  
  local_b1 = (byte)in_ECX & 1;
  local_b2 = (byte)in_R8D & 1;
  local_b3 = in_R9B & 1;
  local_b0 = in_RDX;
  local_a8 = in_RSI;
  local_c8 = std::
             multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>_>
             ::equal_range((multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                           (key_type *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)
                          );
  local_d0._M_node = local_c8.first._M_node;
  while( true ) {
    bVar2 = std::operator!=(&local_d0,&local_c8.second);
    cross_00 = (undefined1)((ulong)in_RDX >> 0x38);
    if (!bVar2) {
      pFVar6 = (FB *)operator_new(0x60);
      uVar8 = in_RDI->m_multi_ghost & 1;
      uVar7 = local_b3 & 1;
      FB::FB(in_stack_fffffffffffffed0,in_RDI,in_RSI,(bool)cross_00,
             (Periodicity *)CONCAT44(in_ECX,in_R8D),(bool)in_stack_fffffffffffffeaf,
             (bool)in_stack_fffffffffffffeae,(bool)in_stack_fffffffffffffead);
      pFVar6->m_nuse = 1;
      local_f8 = pFVar6;
      CacheStats::recordBuild((CacheStats *)CONCAT44(in_stack_fffffffffffffe64,uVar8));
      CacheStats::recordUse((CacheStats *)m_FBC_stats);
      std::
      _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
      ::_Rb_tree_const_iterator(local_110,&local_c8.second);
      std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>::
      pair<amrex::FabArrayBase::BDKey_&,_amrex::FabArrayBase::FB_*&,_true>
                (&local_128,&in_RDI->m_bdkey,&local_f8);
      std::
      multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>_>
      ::insert((multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>_>
                *)CONCAT44(in_stack_fffffffffffffe64,uVar8),in_stack_fffffffffffffe68,
               (value_type *)CONCAT44(in_stack_fffffffffffffe5c,uVar7));
      return local_f8;
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                           *)0x12a600e);
    pIVar4 = &ppVar3->second->m_typ;
    boxArray(in_RDI);
    local_d4 = (uint)BoxArray::ixType((BoxArray *)
                                      CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58))
    ;
    local_10 = &local_d4;
    in_stack_fffffffffffffeaf = false;
    local_8 = pIVar4;
    if (local_d4 == pIVar4->itype) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                             *)0x12a6080);
      pFVar6 = ppVar3->second;
      pIVar5 = &pFVar6->m_crse_ratio;
      boxArray(in_RDI);
      IVar9 = BoxArray::crseRatio(in_stack_fffffffffffffe70);
      local_f0._0_8_ = IVar9.vect._0_8_;
      local_e0._0_4_ = local_f0[0];
      local_e0._4_4_ = local_f0[1];
      uVar1 = local_e0;
      local_f0[2] = IVar9.vect[2];
      local_d8 = local_f0[2];
      local_80 = &local_e0;
      local_4c = 0;
      local_e0._0_4_ = IVar9.vect[0];
      bVar2 = false;
      if (pIVar5->vect[0] == (int)local_e0) {
        local_5c = 1;
        local_e0._4_4_ = IVar9.vect[1];
        bVar2 = false;
        local_58 = local_80;
        if ((pFVar6->m_crse_ratio).vect[1] == local_e0._4_4_) {
          local_6c = 2;
          bVar2 = (pFVar6->m_crse_ratio).vect[2] == local_f0[2];
          local_68 = local_80;
        }
      }
      in_stack_fffffffffffffeaf = false;
      local_f0 = IVar9.vect;
      local_e0 = uVar1;
      local_78 = pIVar5;
      local_48 = local_80;
      if (bVar2) {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                               *)0x12a61cd);
        pFVar6 = ppVar3->second;
        local_88 = &pFVar6->m_ngrow;
        local_90 = local_a8;
        local_18 = local_a8;
        local_1c = 0;
        bVar2 = false;
        if (local_88->vect[0] == local_a8->vect[0]) {
          local_28 = local_a8;
          local_2c = 1;
          bVar2 = false;
          if ((pFVar6->m_ngrow).vect[1] == local_a8->vect[1]) {
            local_38 = local_a8;
            local_3c = 2;
            bVar2 = (pFVar6->m_ngrow).vect[2] == local_a8->vect[2];
          }
        }
        in_stack_fffffffffffffeaf = false;
        if (bVar2) {
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                                 *)0x12a62ce);
          in_stack_fffffffffffffeaf = false;
          if ((ppVar3->second->m_cross & 1U) == (local_b1 & 1)) {
            ppVar3 = std::
                     _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                                   *)0x12a6301);
            in_stack_fffffffffffffeaf = false;
            if ((ppVar3->second->m_multi_ghost & 1U) == (in_RDI->m_multi_ghost & 1U)) {
              ppVar3 = std::
                       _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                       ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                                     *)0x12a633c);
              in_stack_fffffffffffffeaf = false;
              if ((ppVar3->second->m_epo & 1U) == (local_b2 & 1)) {
                ppVar3 = std::
                         _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                         ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                                       *)0x12a636b);
                in_stack_fffffffffffffeaf = false;
                if ((ppVar3->second->m_override_sync & 1U) == (local_b3 & 1)) {
                  ppVar3 = std::
                           _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                           ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                                         *)0x12a639a);
                  in_stack_fffffffffffffeaf =
                       Periodicity::operator==(&ppVar3->second->m_period,local_b0);
                }
              }
            }
          }
        }
      }
    }
    if ((bool)in_stack_fffffffffffffeaf != false) break;
    std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                  *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                         *)0x12a63ca);
  ppVar3->second->m_nuse = ppVar3->second->m_nuse + 1;
  CacheStats::recordUse((CacheStats *)m_FBC_stats);
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::FB_*>_>
                         *)0x12a63f3);
  return ppVar3->second;
}

Assistant:

const FabArrayBase::FB&
FabArrayBase::getFB (const IntVect& nghost, const Periodicity& period,
                     bool cross, bool enforce_periodicity_only,
                     bool override_sync) const
{
    BL_PROFILE("FabArrayBase::getFB()");

    BL_ASSERT(getBDKey() == m_bdkey);
    std::pair<FBCacheIter,FBCacheIter> er_it = m_TheFBCache.equal_range(m_bdkey);
    for (FBCacheIter it = er_it.first; it != er_it.second; ++it)
    {
        if (it->second->m_typ        == boxArray().ixType()      &&
            it->second->m_crse_ratio == boxArray().crseRatio()   &&
            it->second->m_ngrow      == nghost                   &&
            it->second->m_cross      == cross                    &&
            it->second->m_multi_ghost== m_multi_ghost            &&
            it->second->m_epo        == enforce_periodicity_only &&
            it->second->m_override_sync == override_sync         &&
            it->second->m_period     == period              )
        {
            ++(it->second->m_nuse);
            m_FBC_stats.recordUse();
            return *(it->second);
        }
    }

    // Have to build a new one
    FB* new_fb = new FB(*this, nghost, cross, period, enforce_periodicity_only,
                        override_sync, m_multi_ghost);

#ifdef AMREX_MEM_PROFILING
    m_FBC_stats.bytes += new_fb->bytes();
    m_FBC_stats.bytes_hwm = std::max(m_FBC_stats.bytes_hwm, m_FBC_stats.bytes);
#endif

    new_fb->m_nuse = 1;
    m_FBC_stats.recordBuild();
    m_FBC_stats.recordUse();

    m_TheFBCache.insert(er_it.second, FBCache::value_type(m_bdkey,new_fb));

    return *new_fb;
}